

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bte.cpp
# Opt level: O1

void __thiscall merlin::bte::run(bte *this)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  double dVar9;
  timeval tv;
  timeval local_40;
  
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  (this->super_algorithm).m_start_time =
       (double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec;
  (*(this->super_graphical_model)._vptr_graphical_model[0x10])(this);
  propagate(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[BTE] Finished in ",0x12);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  poVar3 = std::ostream::_M_insert<double>
                     (((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) -
                      (this->super_algorithm).m_start_time);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  switch((this->m_task).t_) {
  case PR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PR",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    lVar5 = std::cout;
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb |
         4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar5 + -0x18)) = 6;
    poVar3 = std::ostream::_M_insert<double>(this->m_logz);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    lVar5 = *(long *)poVar3;
    lVar1 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 8) = 6;
    dVar9 = exp(this->m_logz);
    poVar3 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    dVar9 = this->m_logz;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"STATUS",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    if (ABS(dVar9) == INFINITY) {
      pcVar7 = "false: Inconsistent evidence or underflow";
      lVar5 = 0x29;
    }
    else {
      pcVar7 = "true: Consistent evidence";
      lVar5 = 0x19;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar5);
    break;
  case MAR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PR",2);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    lVar5 = std::cout;
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb |
         4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar5 + -0x18)) = 6;
    poVar3 = std::ostream::_M_insert<double>(this->m_logz);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    lVar5 = *(long *)poVar3;
    lVar1 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 8) = 6;
    dVar9 = exp(this->m_logz);
    poVar3 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    dVar9 = this->m_logz;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"STATUS",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    if (ABS(dVar9) == INFINITY) {
      pcVar7 = "false: Inconsistent evidence or underflow";
      lVar5 = 0x29;
    }
    else {
      pcVar7 = "true: Consistent evidence";
      lVar5 = 0x19;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MAR",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    if ((this->m_gmo).m_vadj.
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_gmo).m_vadj.
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        dVar9 = (this->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        uVar4 = (ulong)dVar9;
        uVar4 = (long)(dVar9 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        if (uVar4 != 0) {
          uVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            lVar5 = std::cout;
            *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) &
                 0xfffffefb | 4;
            *(undefined8 *)(operator_delete__ + *(long *)(lVar5 + -0x18)) = 6;
            iVar2 = (*(this->super_graphical_model)._vptr_graphical_model[0xb])(this,uVar6,uVar4);
            std::ostream::_M_insert<double>
                      (*(double *)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x40) + uVar8 * 8));
            uVar8 = uVar8 + 1;
          } while (uVar4 != uVar8);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)(this->m_gmo).m_vadj.
                                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_gmo).m_vadj.
                                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    break;
  case MAP:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    lVar5 = std::cout;
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb |
         4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar5 + -0x18)) = 6;
    poVar3 = std::ostream::_M_insert<double>(this->m_logz);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    lVar5 = *(long *)poVar3;
    lVar1 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 8) = 6;
    dVar9 = exp(this->m_logz);
    poVar3 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MAP",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    if ((this->m_gmo).m_vadj.
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_gmo).m_vadj.
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)(this->m_gmo).m_vadj.
                                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_gmo).m_vadj.
                                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    break;
  case MMAP:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    lVar5 = std::cout;
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb |
         4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar5 + -0x18)) = 6;
    poVar3 = std::ostream::_M_insert<double>(this->m_logz);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
    lVar5 = *(long *)poVar3;
    lVar1 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 8) = 6;
    dVar9 = exp(this->m_logz);
    poVar3 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MMAP",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    if ((this->m_gmo).m_vadj.
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_gmo).m_vadj.
        super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        uVar4 = uVar6 + 0x3f;
        if (-1 < (long)uVar6) {
          uVar4 = uVar6;
        }
        if (((this->m_var_types).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)uVar4 >> 6) +
              (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
             (uVar6 & 0x3f) & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)(this->m_gmo).m_vadj.
                                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_gmo).m_vadj.
                                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    break;
  default:
    return;
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return;
}

Assistant:

void bte::run() {

	// Start the timer and store it
	m_start_time = timeSystem();

	init();
	propagate();

	// Output solution (UAI output format)
	std::cout << "[BTE] Finished in " << (timeSystem() - m_start_time)
			<< " seconds" << std::endl;


	switch (m_task) {
	case Task::PR:	// partition function
		{
			std::cout << "PR" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			if (isinf(m_logz)) {
				std::cout << "STATUS" << std::endl;
				std::cout << "false: Inconsistent evidence or underflow" << std::endl;
			} else {
				std::cout << "STATUS" << std::endl;
				std::cout << "true: Consistent evidence" << std::endl;
			}

			break;
		}
	case Task::MAR:	// marginals
		{
			std::cout << "PR" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			if (isinf(m_logz)) {
				std::cout << "STATUS" << std::endl;
				std::cout << "false: Inconsistent evidence or underflow" << std::endl;
			} else {
				std::cout << "STATUS" << std::endl;
				std::cout << "true: Consistent evidence" << std::endl;
			}

			std::cout << "MAR" << std::endl;
			std::cout << m_gmo.nvar();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				variable VX = m_gmo.var(v);
				std::cout << " " << VX.states();
				for (size_t k = 0; k < VX.states(); ++k) {
					std::cout << " " << std::fixed
						<< std::setprecision(MERLIN_PRECISION)
						<< belief(VX)[k];
				}
			}
			std::cout << std::endl;

			break;
		}
	case Task::MAP: // MAP inference
		{
			std::cout << "Value" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			std::cout << "MAP" << std::endl;
			std::cout << m_gmo.nvar();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				std::cout << " " << m_best_config[v];
			}
			std::cout << std::endl;

			break;
		}
	case Task::MMAP: // Marginal MAP inference
		{
			std::cout << "Value" << std::endl;
			std::cout << std::fixed << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ")" << std::endl;

			std::cout << "MMAP" << std::endl;
			std::cout << m_query.size();
			for (vindex v = 0; v < m_gmo.nvar(); ++v) {
				if (m_var_types[v] == true)
					std::cout << " " << m_best_config[v];
			}
			std::cout << std::endl;

			break;
		}
	}

}